

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haptic2.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  long lVar2;
  undefined8 uVar3;
  Prog prog;
  Theme theme;
  ALLEGRO_FONT *font;
  ALLEGRO_DISPLAY *display;
  Prog *this;
  Prog *in_stack_ffffffffffffe780;
  ALLEGRO_FONT *in_stack_ffffffffffffe7a8;
  Theme *in_stack_ffffffffffffe7b0;
  ALLEGRO_DISPLAY *in_stack_fffffffffffff210;
  Theme *in_stack_fffffffffffff218;
  Prog *in_stack_fffffffffffff220;
  long local_20;
  
  uVar1 = al_install_system(0x85020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init Allegro\n");
  }
  al_init_primitives_addon();
  al_install_keyboard();
  al_install_mouse();
  al_install_joystick();
  uVar1 = al_install_haptic();
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init haptics\n");
  }
  al_init_font_addon();
  al_init_ttf_addon();
  al_set_new_display_flags(0x40);
  lVar2 = al_create_display(800,600);
  if (lVar2 == 0) {
    abort_example("Unable to create display\n");
  }
  open_log();
  local_20 = al_load_font("data/DejaVuSans.ttf",0xb,0);
  if (local_20 == 0) {
    log_printf("Failed to load data/DejaVuSans.ttf\n");
    local_20 = al_create_builtin_font();
    if (local_20 == 0) {
      abort_example("Could not create builtin font.\n");
    }
  }
  joystick_queue = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
  if (joystick_queue == (ALLEGRO_EVENT_QUEUE *)0x0) {
    abort_example("Could not create joystick event queue font.\n");
  }
  this = (Prog *)joystick_queue;
  uVar3 = al_get_joystick_event_source();
  al_register_event_source(this,uVar3);
  get_all_haptics();
  update_timer = (ALLEGRO_TIMER *)al_create_timer(0x3ff0000000000000);
  Theme::Theme(in_stack_ffffffffffffe7b0,in_stack_ffffffffffffe7a8);
  Prog::Prog(in_stack_fffffffffffff220,in_stack_fffffffffffff218,in_stack_fffffffffffff210);
  al_start_timer(update_timer);
  Prog::run(in_stack_ffffffffffffe780);
  al_destroy_timer(update_timer);
  Prog::~Prog(this);
  release_all_haptics();
  al_destroy_event_queue();
  close_log(false);
  al_destroy_font(local_20);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_FONT *font;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro\n");
   }
   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();
   al_install_joystick();
   if (!al_install_haptic()) {
      abort_example("Could not init haptics\n");
   }

   al_init_font_addon();
   al_init_ttf_addon();

   al_set_new_display_flags(ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Unable to create display\n");
   }

   open_log();

   font = al_load_font("data/DejaVuSans.ttf", 11, 0);
   if (!font) {
      log_printf("Failed to load data/DejaVuSans.ttf\n");
      font = al_create_builtin_font();
      if (!font) {
         abort_example("Could not create builtin font.\n");
      }
   }
   
  
   joystick_queue = al_create_event_queue();
   if (!joystick_queue) {
      abort_example("Could not create joystick event queue font.\n");
   }
   
   al_register_event_source(joystick_queue, al_get_joystick_event_source());
  
   
   get_all_haptics();

   /* Don't remove these braces. */
   {
      /* Set up a timer so the display of playback state is polled regularly. */
      update_timer = al_create_timer(1.0);
      Theme theme(font);
      Prog prog(theme, display);
      al_start_timer(update_timer);
      prog.run();
      al_destroy_timer(update_timer);
   }
   
   release_all_haptics();
   al_destroy_event_queue(joystick_queue); 

   close_log(false);
   
   al_destroy_font(font);

   return 0;
}